

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<unsigned_int,_4> __thiscall
tcu::absDiff<unsigned_int,4>(tcu *this,Vector<unsigned_int,_4> *a,Vector<unsigned_int,_4> *b)

{
  uint uVar1;
  uint *puVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  Vector<unsigned_int,_4> VVar4;
  undefined4 local_40;
  undefined4 local_24;
  int ndx;
  Vector<unsigned_int,_4> *b_local;
  Vector<unsigned_int,_4> *a_local;
  Vector<unsigned_int,_4> *res;
  
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  uVar3 = extraout_RDX;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    puVar2 = Vector<unsigned_int,_4>::operator[](a,local_24);
    uVar1 = *puVar2;
    puVar2 = Vector<unsigned_int,_4>::operator[](b,local_24);
    if (*puVar2 < uVar1) {
      puVar2 = Vector<unsigned_int,_4>::operator[](a,local_24);
      local_40 = *puVar2;
      puVar2 = Vector<unsigned_int,_4>::operator[](b,local_24);
      local_40 = local_40 - *puVar2;
    }
    else {
      puVar2 = Vector<unsigned_int,_4>::operator[](b,local_24);
      local_40 = *puVar2;
      puVar2 = Vector<unsigned_int,_4>::operator[](a,local_24);
      local_40 = local_40 - *puVar2;
    }
    puVar2 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_24);
    *puVar2 = local_40;
    uVar3 = extraout_RDX_00;
  }
  VVar4.m_data[2] = (int)uVar3;
  VVar4.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  VVar4.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar4.m_data;
}

Assistant:

static inline Vector<T, Size> absDiff (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	Vector<T, Size> res;

	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = (a[ndx] > b[ndx]) ? (a[ndx] - b[ndx]) : (b[ndx] - a[ndx]);

	return res;
}